

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

EnvNAVXYTHETALATHashEntry_t * __thiscall
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_hash
          (EnvironmentNAVXYTHETALAT *this,int X,int Y,int Theta)

{
  pointer ppiVar1;
  int iVar2;
  SBPL_Exception *this_00;
  long lVar3;
  int *entry;
  EnvNAVXYTHETALATHashEntry_t *HashEntry;
  
  HashEntry = (EnvNAVXYTHETALATHashEntry_t *)operator_new(0x14);
  HashEntry->X = X;
  HashEntry->Y = Y;
  HashEntry->Theta = (char)Theta;
  HashEntry->iteration = 0;
  HashEntry->stateID =
       (int)((ulong)((long)(this->StateID2CoordTable).
                           super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->StateID2CoordTable).
                          super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
  push_back(&this->StateID2CoordTable,&HashEntry);
  iVar2 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
            _vptr_DiscreteSpaceInformation[0x59])
                    (this,(ulong)(uint)HashEntry->X,(ulong)(uint)HashEntry->Y,
                     (ulong)(uint)(int)HashEntry->Theta);
  std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
  push_back(this->Coord2StateIDHashTable + iVar2,&HashEntry);
  entry = (int *)operator_new__(8);
  std::vector<int_*,_std::allocator<int_*>_>::push_back
            (&(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
              StateID2IndexMapping,&entry);
  ppiVar1 = (this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
            StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 2) break;
    ppiVar1[HashEntry->stateID][lVar3] = -1;
    lVar3 = lVar3 + 1;
  }
  if (HashEntry->stateID ==
      (int)((ulong)((long)(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                          StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppiVar1) >> 3) + -1) {
    return HashEntry;
  }
  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception
            (this_00,"ERROR in Env... function: last state has incorrect stateID");
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

EnvNAVXYTHETALATHashEntry_t*
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_hash(int X, int Y, int Theta)
{
    int i;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    EnvNAVXYTHETALATHashEntry_t* HashEntry = new EnvNAVXYTHETALATHashEntry_t;

    HashEntry->X = X;
    HashEntry->Y = Y;
    HashEntry->Theta = Theta;
    HashEntry->iteration = 0;

    HashEntry->stateID = StateID2CoordTable.size();

    // insert into the tables
    StateID2CoordTable.push_back(HashEntry);

    // get the hash table bin
    i = GETHASHBIN(HashEntry->X, HashEntry->Y, HashEntry->Theta);

    // insert the entry into the bin
    Coord2StateIDHashTable[i].push_back(HashEntry);

    // insert into and initialize the mappings
    int* entry = new int[NUMOFINDICES_STATEID2IND];
    StateID2IndexMapping.push_back(entry);
    for (i = 0; i < NUMOFINDICES_STATEID2IND; i++) {
        StateID2IndexMapping[HashEntry->stateID][i] = -1;
    }

    if (HashEntry->stateID != (int)StateID2IndexMapping.size() - 1) {
        throw SBPL_Exception("ERROR in Env... function: last state has incorrect stateID");
    }

#if TIME_DEBUG
    time_createhash += clock() - currenttime;
#endif

    return HashEntry;
}